

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_axi.c
# Opt level: O0

REF_STATUS ref_axi_wedge(REF_GRID ref_grid)

{
  double dVar1;
  REF_NODE ref_node_00;
  REF_CELL pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  void *__ptr;
  long lVar5;
  double dVar6;
  double local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  double local_188;
  double local_180;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_DBL wedge_angle;
  REF_DBL radius;
  REF_INT local_108;
  REF_INT new_cell;
  REF_INT unique [8];
  int local_dc;
  REF_INT local_d8;
  REF_INT nunique;
  REF_INT pri_nodes [8];
  REF_INT pyr_nodes [8];
  REF_INT new_nodes [8];
  REF_INT nodes [8];
  long lStack_50;
  REF_INT cell;
  REF_GLOB global;
  REF_GLOB nhalf;
  REF_INT node;
  REF_INT *o2n;
  REF_DBL pole_tol;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  if (ref_node_00->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c",0x31,
           "ref_axi_wedge","malloc o2n of REF_INT negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)ref_node_00->n << 2);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c",0x31,
             "ref_axi_wedge","malloc o2n of REF_INT NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_node_00->n;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        *(undefined4 *)((long)__ptr + (long)ref_private_macro_code_rss_1 * 4) = 0xffffffff;
      }
      lVar5 = ref_node_00->old_n_global / 2;
      for (nhalf._4_4_ = 0; nhalf._4_4_ < ref_node_00->max; nhalf._4_4_ = nhalf._4_4_ + 1) {
        if (((-1 < nhalf._4_4_) && (nhalf._4_4_ < ref_node_00->max)) &&
           (-1 < ref_node_00->global[nhalf._4_4_])) {
          if (ref_node_00->real[nhalf._4_4_ * 0xf + 2] <= 0.0) {
            local_180 = -ref_node_00->real[nhalf._4_4_ * 0xf + 2];
          }
          else {
            local_180 = ref_node_00->real[nhalf._4_4_ * 0xf + 2];
          }
          if (1e-06 <= local_180) {
LAB_001383df:
            *(int *)((long)__ptr + (long)nhalf._4_4_ * 4) = nhalf._4_4_;
          }
          else {
            if (ref_node_00->real[nhalf._4_4_ * 0xf + 1] <= 0.0) {
              local_188 = -ref_node_00->real[nhalf._4_4_ * 0xf + 1];
            }
            else {
              local_188 = ref_node_00->real[nhalf._4_4_ * 0xf + 1];
            }
            if (local_188 <= 0.5) goto LAB_001383df;
            if (((nhalf._4_4_ < 0) || (ref_node_00->max <= nhalf._4_4_)) ||
               (ref_node_00->global[nhalf._4_4_] < 0)) {
              local_190 = -1;
            }
            else {
              local_190 = ref_node_00->global[nhalf._4_4_];
            }
            if (local_190 < lVar5) {
              printf("not expecting less than half, unless unit test\n");
              if (((nhalf._4_4_ < 0) || (ref_node_00->max <= nhalf._4_4_)) ||
                 (ref_node_00->global[nhalf._4_4_] < 0)) {
                local_198 = -1;
              }
              else {
                local_198 = ref_node_00->global[nhalf._4_4_];
              }
              lStack_50 = local_198 + lVar5;
            }
            else {
              if (((nhalf._4_4_ < 0) || (ref_node_00->max <= nhalf._4_4_)) ||
                 (ref_node_00->global[nhalf._4_4_] < 0)) {
                local_1a0 = -1;
              }
              else {
                local_1a0 = ref_node_00->global[nhalf._4_4_];
              }
              lStack_50 = local_1a0 - lVar5;
            }
            uVar3 = ref_node_local(ref_node_00,lStack_50,
                                   (REF_INT *)((long)__ptr + (long)nhalf._4_4_ * 4));
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,0x42,"ref_axi_wedge",(ulong)uVar3,"localize");
              return uVar3;
            }
            if (ref_node_00->ref_mpi->id == ref_node_00->part[nhalf._4_4_]) {
              uVar3 = ref_node_remove(ref_node_00,nhalf._4_4_);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0x45,"ref_axi_wedge",(ulong)uVar3,"remove");
                return uVar3;
              }
            }
            else {
              uVar3 = ref_node_remove_without_global(ref_node_00,nhalf._4_4_);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0x47,"ref_axi_wedge",(ulong)uVar3,"remove");
                return uVar3;
              }
            }
          }
          if (((-1 < nhalf._4_4_) && (nhalf._4_4_ < ref_node_00->max)) &&
             (-1 < ref_node_00->global[nhalf._4_4_])) {
            if (ref_node_00->real[nhalf._4_4_ * 0xf + 1] <= 0.0) {
              local_1a8 = -ref_node_00->real[nhalf._4_4_ * 0xf + 1];
            }
            else {
              local_1a8 = ref_node_00->real[nhalf._4_4_ * 0xf + 1];
            }
            if (0.5 < local_1a8) {
              dVar1 = ref_node_00->real[nhalf._4_4_ * 0xf + 2];
              dVar6 = sin(0.017453292519943278);
              ref_node_00->real[nhalf._4_4_ * 0xf + 1] = dVar1 * dVar6;
              dVar6 = cos(0.017453292519943278);
              ref_node_00->real[nhalf._4_4_ * 0xf + 2] = dVar1 * dVar6;
            }
          }
        }
      }
      ref_grid_local._4_4_ = ref_node_synchronize_globals(ref_node_00);
      if (ref_grid_local._4_4_ == 0) {
        pRVar2 = ref_grid->cell[3];
        for (nodes[7] = 0; nodes[7] < pRVar2->max; nodes[7] = nodes[7] + 1) {
          RVar4 = ref_cell_nodes(pRVar2,nodes[7],new_nodes + 6);
          if (RVar4 == 0) {
            for (nhalf._4_4_ = 0; nhalf._4_4_ < 3; nhalf._4_4_ = nhalf._4_4_ + 1) {
              pyr_nodes[(long)nhalf._4_4_ + 6] =
                   *(REF_INT *)((long)__ptr + (long)new_nodes[(long)nhalf._4_4_ + 6] * 4);
            }
            new_nodes[1] = nodes[1];
            uVar3 = ref_cell_replace_whole(pRVar2,nodes[7],pyr_nodes + 6);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,0x5b,"ref_axi_wedge",(ulong)uVar3,"renum");
              return uVar3;
            }
          }
        }
        pRVar2 = ref_grid->cell[6];
        for (nodes[7] = 0; nodes[7] < pRVar2->max; nodes[7] = nodes[7] + 1) {
          RVar4 = ref_cell_nodes(pRVar2,nodes[7],new_nodes + 6);
          if (RVar4 == 0) {
            for (nhalf._4_4_ = 0; nhalf._4_4_ < 4; nhalf._4_4_ = nhalf._4_4_ + 1) {
              pyr_nodes[(long)nhalf._4_4_ + 6] =
                   *(REF_INT *)((long)__ptr + (long)new_nodes[(long)nhalf._4_4_ + 6] * 4);
            }
            new_nodes[2] = nodes[2];
            uVar3 = ref_sort_unique_int(4,pyr_nodes + 6,&local_dc,&local_108);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,99,"ref_axi_wedge",(ulong)uVar3,"uniq");
              return uVar3;
            }
            if ((local_dc < 4) && (uVar3 = ref_cell_remove(pRVar2,nodes[7]), uVar3 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,100,"ref_axi_wedge",(ulong)uVar3,"rm qua");
              return uVar3;
            }
            if (local_dc == 3) {
              if (new_nodes[0] == new_nodes[1]) {
                new_nodes[1] = new_nodes[2];
              }
              if (pyr_nodes[7] == new_nodes[0]) {
                new_nodes[0] = new_nodes[1];
                new_nodes[1] = new_nodes[2];
              }
              if (pyr_nodes[6] == pyr_nodes[7]) {
                pyr_nodes[7] = new_nodes[0];
                new_nodes[0] = new_nodes[1];
                new_nodes[1] = new_nodes[2];
              }
              if (new_nodes[1] == pyr_nodes[6]) {
                pyr_nodes[6] = pyr_nodes[7];
                pyr_nodes[7] = new_nodes[0];
                new_nodes[0] = new_nodes[1];
                new_nodes[1] = new_nodes[2];
              }
              uVar3 = ref_cell_add(ref_grid->cell[3],pyr_nodes + 6,(REF_INT *)((long)&radius + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0x79,"ref_axi_wedge",(ulong)uVar3,"new cell");
                return uVar3;
              }
            }
            if (local_dc == 4) {
              for (nhalf._4_4_ = 0; nhalf._4_4_ < 4; nhalf._4_4_ = nhalf._4_4_ + 1) {
                pyr_nodes[(long)nhalf._4_4_ + 6] =
                     *(REF_INT *)((long)__ptr + (long)new_nodes[(long)nhalf._4_4_ + 6] * 4);
              }
              new_nodes[2] = nodes[2];
              uVar3 = ref_cell_replace_whole(pRVar2,nodes[7],pyr_nodes + 6);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0x7e,"ref_axi_wedge",(ulong)uVar3,"renum");
                return uVar3;
              }
            }
          }
        }
        pRVar2 = ref_grid->cell[10];
        for (nodes[7] = 0; nodes[7] < pRVar2->max; nodes[7] = nodes[7] + 1) {
          RVar4 = ref_cell_nodes(pRVar2,nodes[7],new_nodes + 6);
          if (RVar4 == 0) {
            for (nhalf._4_4_ = 0; nhalf._4_4_ < 6; nhalf._4_4_ = nhalf._4_4_ + 1) {
              pyr_nodes[(long)nhalf._4_4_ + 6] =
                   *(REF_INT *)((long)__ptr + (long)new_nodes[(long)nhalf._4_4_ + 6] * 4);
            }
            uVar3 = ref_sort_unique_int(6,pyr_nodes + 6,&local_dc,&local_108);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,0x86,"ref_axi_wedge",(ulong)uVar3,"uniq");
              return uVar3;
            }
            if ((local_dc < 6) && (uVar3 = ref_cell_remove(pRVar2,nodes[7]), uVar3 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,0x87,"ref_axi_wedge",(ulong)uVar3,"rm qua");
              return uVar3;
            }
            if (local_dc == 5) {
              if (pyr_nodes[6] == new_nodes[1]) {
                pri_nodes[6] = pyr_nodes[7];
                pri_nodes[7] = new_nodes[0];
                pyr_nodes[0] = pyr_nodes[6];
                pyr_nodes[1] = new_nodes[2];
                pyr_nodes[2] = new_nodes[3];
              }
              if (pyr_nodes[7] == new_nodes[2]) {
                pri_nodes[6] = new_nodes[0];
                pri_nodes[7] = pyr_nodes[6];
                pyr_nodes[0] = pyr_nodes[7];
                pyr_nodes[1] = new_nodes[3];
                pyr_nodes[2] = new_nodes[1];
              }
              if (new_nodes[0] == new_nodes[3]) {
                pri_nodes[6] = pyr_nodes[6];
                pri_nodes[7] = pyr_nodes[7];
                pyr_nodes[0] = new_nodes[0];
                pyr_nodes[1] = new_nodes[1];
                pyr_nodes[2] = new_nodes[2];
              }
              uVar3 = ref_cell_add(ref_grid->cell[9],pri_nodes + 6,(REF_INT *)((long)&radius + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0x9f,"ref_axi_wedge",(ulong)uVar3,"new cell");
                return uVar3;
              }
            }
            if (local_dc == 4) {
              if (pyr_nodes[7] != new_nodes[2]) {
                new_nodes[1] = new_nodes[2];
              }
              if (new_nodes[0] != new_nodes[3]) {
                new_nodes[1] = new_nodes[3];
              }
              uVar3 = ref_cell_add(ref_grid->cell[8],pyr_nodes + 6,(REF_INT *)((long)&radius + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0xa5,"ref_axi_wedge",(ulong)uVar3,"new cell");
                return uVar3;
              }
            }
          }
        }
        pRVar2 = ref_grid->cell[0xb];
        for (nodes[7] = 0; nodes[7] < pRVar2->max; nodes[7] = nodes[7] + 1) {
          RVar4 = ref_cell_nodes(pRVar2,nodes[7],new_nodes + 6);
          if (RVar4 == 0) {
            for (nhalf._4_4_ = 0; nhalf._4_4_ < 8; nhalf._4_4_ = nhalf._4_4_ + 1) {
              pyr_nodes[(long)nhalf._4_4_ + 6] =
                   *(REF_INT *)((long)__ptr + (long)new_nodes[(long)nhalf._4_4_ + 6] * 4);
            }
            uVar3 = ref_sort_unique_int(8,pyr_nodes + 6,&local_dc,&local_108);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,0xad,"ref_axi_wedge",(ulong)uVar3,"uniq");
              return uVar3;
            }
            if (local_dc != 8) {
              if ((local_dc < 8) && (uVar3 = ref_cell_remove(pRVar2,nodes[7]), uVar3 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0xaf,"ref_axi_wedge",(ulong)uVar3,"rm qua");
                return uVar3;
              }
              if ((long)local_dc != 6) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0xb0,"ref_axi_wedge","expected 6 unique hex nodes on pole",6,(long)local_dc)
                ;
                return 1;
              }
              if (local_dc == 6) {
                local_d8 = -1;
                if ((pyr_nodes[6] == pyr_nodes[7]) && (new_nodes[2] == new_nodes[3])) {
                  local_d8 = pyr_nodes[6];
                  nunique = new_nodes[0];
                  pri_nodes[0] = new_nodes[1];
                  pri_nodes[1] = new_nodes[2];
                  pri_nodes[2] = new_nodes[4];
                  pri_nodes[3] = new_nodes[5];
                }
                if ((pyr_nodes[6] == new_nodes[2]) && (pyr_nodes[7] == new_nodes[3])) {
                  local_d8 = pyr_nodes[6];
                  nunique = new_nodes[1];
                  pri_nodes[0] = new_nodes[5];
                  pri_nodes[1] = pyr_nodes[7];
                  pri_nodes[2] = new_nodes[0];
                  pri_nodes[3] = new_nodes[4];
                }
                if ((pyr_nodes[7] == new_nodes[0]) && (new_nodes[3] == new_nodes[4])) {
                  local_d8 = pyr_nodes[6];
                  nunique = pyr_nodes[7];
                  pri_nodes[0] = new_nodes[1];
                  pri_nodes[1] = new_nodes[2];
                  pri_nodes[2] = new_nodes[3];
                  pri_nodes[3] = new_nodes[5];
                }
                if ((pyr_nodes[7] == new_nodes[3]) && (new_nodes[0] == new_nodes[4])) {
                  local_d8 = pyr_nodes[6];
                  nunique = new_nodes[2];
                  pri_nodes[0] = pyr_nodes[7];
                  pri_nodes[1] = pyr_nodes[6];
                  pri_nodes[2] = new_nodes[5];
                  pri_nodes[3] = new_nodes[0];
                }
                if ((new_nodes[1] == new_nodes[5]) && (new_nodes[0] == new_nodes[4])) {
                  local_d8 = pyr_nodes[6];
                  nunique = new_nodes[1];
                  pri_nodes[0] = new_nodes[2];
                  pri_nodes[1] = pyr_nodes[7];
                  pri_nodes[2] = new_nodes[0];
                  pri_nodes[3] = new_nodes[3];
                }
                if ((new_nodes[1] == new_nodes[0]) && (new_nodes[5] == new_nodes[4])) {
                  local_d8 = pyr_nodes[6];
                  nunique = pyr_nodes[7];
                  pri_nodes[0] = new_nodes[0];
                  pri_nodes[1] = new_nodes[2];
                  pri_nodes[2] = new_nodes[3];
                  pri_nodes[3] = new_nodes[4];
                }
                if ((pyr_nodes[6] == new_nodes[2]) && (new_nodes[1] == new_nodes[5])) {
                  local_d8 = pyr_nodes[6];
                  nunique = new_nodes[3];
                  pri_nodes[0] = pyr_nodes[7];
                  pri_nodes[1] = new_nodes[1];
                  pri_nodes[2] = new_nodes[4];
                  pri_nodes[3] = pyr_nodes[7];
                }
                if ((pyr_nodes[6] == new_nodes[1]) && (new_nodes[2] == new_nodes[5])) {
                  local_d8 = pyr_nodes[6];
                  nunique = pyr_nodes[7];
                  pri_nodes[0] = new_nodes[0];
                  pri_nodes[1] = new_nodes[2];
                  pri_nodes[2] = new_nodes[3];
                  pri_nodes[3] = new_nodes[4];
                }
                if ((pyr_nodes[6] == pyr_nodes[7]) && (new_nodes[1] == new_nodes[0])) {
                  local_d8 = pyr_nodes[6];
                  nunique = new_nodes[2];
                  pri_nodes[0] = new_nodes[3];
                  pri_nodes[1] = new_nodes[1];
                  pri_nodes[2] = new_nodes[5];
                  pri_nodes[3] = new_nodes[4];
                }
                if ((pyr_nodes[6] == new_nodes[1]) && (pyr_nodes[7] == new_nodes[0])) {
                  local_d8 = pyr_nodes[6];
                  nunique = new_nodes[5];
                  pri_nodes[0] = new_nodes[2];
                  pri_nodes[1] = pyr_nodes[7];
                  pri_nodes[2] = new_nodes[4];
                  pri_nodes[3] = new_nodes[3];
                }
                if ((new_nodes[2] == new_nodes[3]) && (new_nodes[5] == new_nodes[4])) {
                  local_d8 = pyr_nodes[6];
                  nunique = new_nodes[2];
                  pri_nodes[0] = pyr_nodes[7];
                  pri_nodes[1] = pyr_nodes[6];
                  pri_nodes[2] = new_nodes[5];
                  pri_nodes[3] = new_nodes[0];
                }
                if ((new_nodes[2] == new_nodes[5]) && (new_nodes[3] == new_nodes[4])) {
                  local_d8 = pyr_nodes[7];
                  nunique = new_nodes[3];
                  pri_nodes[0] = new_nodes[0];
                  pri_nodes[1] = pyr_nodes[6];
                  pri_nodes[2] = new_nodes[2];
                  pri_nodes[3] = new_nodes[1];
                }
                uVar3 = ref_cell_add(ref_grid->cell[10],&local_d8,(REF_INT *)((long)&radius + 4));
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                         ,0x126,"ref_axi_wedge",(ulong)uVar3,"new cell");
                  return uVar3;
                }
              }
            }
          }
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c",0x54,
               "ref_axi_wedge",(ulong)ref_grid_local._4_4_,"sync");
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_axi_wedge(REF_GRID ref_grid) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL pole_tol;
  REF_INT *o2n, node;
  REF_GLOB nhalf, global;

  REF_INT cell, nodes[8], new_nodes[8], pyr_nodes[8], pri_nodes[8];
  REF_INT nunique, unique[8];
  REF_INT new_cell;

  REF_DBL radius, wedge_angle;

  ref_node = ref_grid_node(ref_grid);

  ref_malloc_init(o2n, ref_node_n(ref_node), REF_INT, REF_EMPTY);

  pole_tol = 1.0e-6; /* drop to smaller number */
  wedge_angle = ref_math_in_radians(1.0);

  /* make half logic globals, RCB can scrambles local indexes */
  nhalf = ref_node_n_global(ref_node) / 2;
  each_ref_node_valid_node(ref_node, node) {
    if (ABS(ref_node_xyz(ref_node, 2, node)) < pole_tol &&
        ABS(ref_node_xyz(ref_node, 1, node)) > 0.5) {
      if (ref_node_global(ref_node, node) < nhalf) {
        printf("not expecting less than half, unless unit test\n");
        global = ref_node_global(ref_node, node) + nhalf;
      } else {
        /* set to pair on plane that is kept */
        global = ref_node_global(ref_node, node) - nhalf;
      }
      RSS(ref_node_local(ref_node, global, &(o2n[node])), "localize");
      /* remove if you own it, remove without global if you don't own it */
      if (ref_node_owned(ref_node, node)) {
        RSS(ref_node_remove(ref_node, node), "remove");
      } else {
        RSS(ref_node_remove_without_global(ref_node, node), "remove");
      }
    } else {
      o2n[node] = node;
    }
    if (ref_node_valid(ref_node, node) && /* ignore collapsed nodes */
        ABS(ref_node_xyz(ref_node, 1, node)) > 0.5) {
      radius = ref_node_xyz(ref_node, 2, node);
      ref_node_xyz(ref_node, 1, node) = radius * sin(wedge_angle);
      ref_node_xyz(ref_node, 2, node) = radius * cos(wedge_angle);
    }
  }

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 3; node++) new_nodes[node] = o2n[nodes[node]];
    new_nodes[3] = nodes[3];
    RSS(ref_cell_replace_whole(ref_cell, cell, new_nodes), "renum");
  }

  ref_cell = ref_grid_qua(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 4; node++) new_nodes[node] = o2n[nodes[node]];
    new_nodes[4] = nodes[4];
    RSS(ref_sort_unique_int(4, new_nodes, &nunique, unique), "uniq");
    if (4 > nunique) RSS(ref_cell_remove(ref_cell, cell), "rm qua");
    if (3 == nunique) {
      if (new_nodes[2] == new_nodes[3]) {
        new_nodes[3] = new_nodes[4];
      }
      if (new_nodes[1] == new_nodes[2]) {
        new_nodes[2] = new_nodes[3];
        new_nodes[3] = new_nodes[4];
      }
      if (new_nodes[0] == new_nodes[1]) {
        new_nodes[1] = new_nodes[2];
        new_nodes[2] = new_nodes[3];
        new_nodes[3] = new_nodes[4];
      }
      if (new_nodes[3] == new_nodes[0]) {
        new_nodes[0] = new_nodes[1];
        new_nodes[1] = new_nodes[2];
        new_nodes[2] = new_nodes[3];
        new_nodes[3] = new_nodes[4];
      }
      RSS(ref_cell_add(ref_grid_tri(ref_grid), new_nodes, &new_cell),
          "new cell");
    }
    if (4 == nunique) {
      for (node = 0; node < 4; node++) new_nodes[node] = o2n[nodes[node]];
      new_nodes[4] = nodes[4];
      RSS(ref_cell_replace_whole(ref_cell, cell, new_nodes), "renum");
    }
  }

  ref_cell = ref_grid_pri(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 6; node++) new_nodes[node] = o2n[nodes[node]];
    RSS(ref_sort_unique_int(6, new_nodes, &nunique, unique), "uniq");
    if (6 > nunique) RSS(ref_cell_remove(ref_cell, cell), "rm qua");
    if (5 == nunique) {
      if (new_nodes[0] == new_nodes[3]) {
        pyr_nodes[0] = new_nodes[1];
        pyr_nodes[1] = new_nodes[2];
        pyr_nodes[2] = new_nodes[0];
        pyr_nodes[3] = new_nodes[4];
        pyr_nodes[4] = new_nodes[5];
      }
      if (new_nodes[1] == new_nodes[4]) {
        pyr_nodes[0] = new_nodes[2];
        pyr_nodes[1] = new_nodes[0];
        pyr_nodes[2] = new_nodes[1];
        pyr_nodes[3] = new_nodes[5];
        pyr_nodes[4] = new_nodes[3];
      }
      if (new_nodes[2] == new_nodes[5]) {
        pyr_nodes[0] = new_nodes[0];
        pyr_nodes[1] = new_nodes[1];
        pyr_nodes[2] = new_nodes[2];
        pyr_nodes[3] = new_nodes[3];
        pyr_nodes[4] = new_nodes[4];
      }
      RSS(ref_cell_add(ref_grid_pyr(ref_grid), pyr_nodes, &new_cell),
          "new cell");
    }
    if (4 == nunique) {
      if (new_nodes[1] != new_nodes[4]) new_nodes[3] = new_nodes[4];
      if (new_nodes[2] != new_nodes[5]) new_nodes[3] = new_nodes[5];
      RSS(ref_cell_add(ref_grid_tet(ref_grid), new_nodes, &new_cell),
          "new cell");
    }
  }

  ref_cell = ref_grid_hex(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 8; node++) new_nodes[node] = o2n[nodes[node]];
    RSS(ref_sort_unique_int(8, new_nodes, &nunique, unique), "uniq");
    if (8 == nunique) continue;
    if (8 > nunique) RSS(ref_cell_remove(ref_cell, cell), "rm qua");
    REIS(6, nunique, "expected 6 unique hex nodes on pole");
    if (6 == nunique) {
      pri_nodes[0] = REF_EMPTY;

      /* 0: 0 4 5 1 */
      if (new_nodes[0] == new_nodes[1] && new_nodes[4] == new_nodes[5]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[2];
        pri_nodes[2] = new_nodes[3];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[6];
        pri_nodes[5] = new_nodes[7];
      }
      if (new_nodes[0] == new_nodes[4] && new_nodes[1] == new_nodes[5]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[3];
        pri_nodes[2] = new_nodes[7];
        pri_nodes[3] = new_nodes[1];
        pri_nodes[4] = new_nodes[2];
        pri_nodes[5] = new_nodes[6];
      }

      /* 1: 1 5 6 2 */
      if (new_nodes[1] == new_nodes[2] && new_nodes[5] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[1];
        pri_nodes[2] = new_nodes[3];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[5];
        pri_nodes[5] = new_nodes[7];
      }
      if (new_nodes[1] == new_nodes[5] && new_nodes[2] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[4];
        pri_nodes[2] = new_nodes[1];
        pri_nodes[3] = new_nodes[0];
        pri_nodes[4] = new_nodes[7];
        pri_nodes[5] = new_nodes[2];
      }

      /* 2: 2 6 7 3 */
      if (new_nodes[3] == new_nodes[7] && new_nodes[2] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[3];
        pri_nodes[2] = new_nodes[4];
        pri_nodes[3] = new_nodes[1];
        pri_nodes[4] = new_nodes[2];
        pri_nodes[5] = new_nodes[5];
      }
      if (new_nodes[3] == new_nodes[2] && new_nodes[7] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[1];
        pri_nodes[2] = new_nodes[2];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[5];
        pri_nodes[5] = new_nodes[6];
      }

      /* 3: 0 3 7 4 */
      if (new_nodes[0] == new_nodes[4] && new_nodes[3] == new_nodes[7]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[5];
        pri_nodes[2] = new_nodes[1];
        pri_nodes[3] = new_nodes[3];
        pri_nodes[4] = new_nodes[6];
        pri_nodes[5] = new_nodes[1];
      }
      if (new_nodes[0] == new_nodes[3] && new_nodes[4] == new_nodes[7]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[1];
        pri_nodes[2] = new_nodes[2];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[5];
        pri_nodes[5] = new_nodes[6];
      }

      /* 4: 0 1 2 3 */
      if (new_nodes[0] == new_nodes[1] && new_nodes[3] == new_nodes[2]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[4];
        pri_nodes[2] = new_nodes[5];
        pri_nodes[3] = new_nodes[3];
        pri_nodes[4] = new_nodes[7];
        pri_nodes[5] = new_nodes[6];
      }
      if (new_nodes[0] == new_nodes[3] && new_nodes[1] == new_nodes[2]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[7];
        pri_nodes[2] = new_nodes[4];
        pri_nodes[3] = new_nodes[1];
        pri_nodes[4] = new_nodes[6];
        pri_nodes[5] = new_nodes[5];
      }

      /* 5: 4 7 6 5 */
      if (new_nodes[4] == new_nodes[5] && new_nodes[7] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[4];
        pri_nodes[2] = new_nodes[1];
        pri_nodes[3] = new_nodes[0];
        pri_nodes[4] = new_nodes[7];
        pri_nodes[5] = new_nodes[2];
      }
      if (new_nodes[4] == new_nodes[7] && new_nodes[5] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[1];
        pri_nodes[1] = new_nodes[5];
        pri_nodes[2] = new_nodes[2];
        pri_nodes[3] = new_nodes[0];
        pri_nodes[4] = new_nodes[4];
        pri_nodes[5] = new_nodes[3];
      }

      /*
      printf(" new %d %d %d %d    %d %d %d %d\n", new_nodes[0], new_nodes[1],
             new_nodes[2], new_nodes[3], new_nodes[4], new_nodes[5],
             new_nodes[6], new_nodes[7]);
             */
      RSS(ref_cell_add(ref_grid_pri(ref_grid), pri_nodes, &new_cell),
          "new cell");
    }
  }

  ref_free(o2n);

  return REF_SUCCESS;
}